

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.cpp
# Opt level: O3

void __thiscall CNetAddr::SetLegacyIPv6(CNetAddr *this,Span<const_unsigned_char> ipv6)

{
  long *plVar1;
  long lVar2;
  long in_FS_OFFSET;
  uchar local_9;
  long local_8;
  
  plVar1 = (long *)ipv6.m_data;
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (ipv6.m_size != 0x10) {
    __assert_fail("ipv6.size() == ADDR_IPV6_SIZE",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/netaddress.cpp"
                  ,0x8b,"void CNetAddr::SetLegacyIPv6(Span<const uint8_t>)");
  }
  if ((int)plVar1[1] == -0x10000 && *plVar1 == 0) {
    this->m_net = NET_IPV4;
    lVar2 = 0xc;
  }
  else {
    if (*(short *)((long)plVar1 + 4) == 0x43eb && (int)*plVar1 == 0x7ed887fd) {
      this->m_net = NET_IPV6;
      local_9 = '\0';
      prevector<16U,_unsigned_char,_unsigned_int,_int>::assign(&this->m_addr,0x10,&local_9);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        return;
      }
      goto LAB_00d733bc;
    }
    if (*(short *)((long)plVar1 + 4) == 0x2487 && (int)*plVar1 == -0x3f779403) {
      this->m_net = NET_INTERNAL;
      lVar2 = 6;
    }
    else {
      this->m_net = NET_IPV6;
      lVar2 = 0;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    prevector<16U,_unsigned_char,_unsigned_int,_int>::assign<const_unsigned_char_*>
              (&this->m_addr,(uchar *)(lVar2 + (long)plVar1),(uchar *)(plVar1 + 2));
    return;
  }
LAB_00d733bc:
  __stack_chk_fail();
}

Assistant:

void CNetAddr::SetLegacyIPv6(Span<const uint8_t> ipv6)
{
    assert(ipv6.size() == ADDR_IPV6_SIZE);

    size_t skip{0};

    if (HasPrefix(ipv6, IPV4_IN_IPV6_PREFIX)) {
        // IPv4-in-IPv6
        m_net = NET_IPV4;
        skip = sizeof(IPV4_IN_IPV6_PREFIX);
    } else if (HasPrefix(ipv6, TORV2_IN_IPV6_PREFIX)) {
        // TORv2-in-IPv6 (unsupported). Unserialize as !IsValid(), thus ignoring them.
        // Mimic a default-constructed CNetAddr object which is !IsValid() and thus
        // will not be gossiped, but continue reading next addresses from the stream.
        m_net = NET_IPV6;
        m_addr.assign(ADDR_IPV6_SIZE, 0x0);
        return;
    } else if (HasPrefix(ipv6, INTERNAL_IN_IPV6_PREFIX)) {
        // Internal-in-IPv6
        m_net = NET_INTERNAL;
        skip = sizeof(INTERNAL_IN_IPV6_PREFIX);
    } else {
        // IPv6
        m_net = NET_IPV6;
    }

    m_addr.assign(ipv6.begin() + skip, ipv6.end());
}